

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O0

int ReadUntilRS232Port(RS232PORT *pRS232Port,uint8 *readbuf,char endchar,int maxreadbuflen)

{
  int iVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int Bytes;
  int BytesReceived;
  int maxreadbuflen_local;
  char endchar_local;
  uint8 *readbuf_local;
  RS232PORT *pRS232Port_local;
  
  local_2c = 0;
  local_30 = 0;
  Bytes = maxreadbuflen;
  BytesReceived._3_1_ = endchar;
  _maxreadbuflen_local = readbuf;
  readbuf_local = (uint8 *)pRS232Port;
  while( true ) {
    bVar2 = true;
    if (0 < local_2c) {
      bVar2 = (uint)_maxreadbuflen_local[local_2c + -1] != (int)BytesReceived._3_1_;
    }
    if (!bVar2) {
      return 0;
    }
    if (Bytes <= local_2c) {
      return 6;
    }
    iVar1 = ReadRS232Port((RS232PORT *)readbuf_local,_maxreadbuflen_local + local_2c,1,&local_30);
    if (iVar1 != 0) break;
    if (local_30 == 0) {
      return 2;
    }
    local_2c = local_30 + local_2c;
  }
  return 1;
}

Assistant:

inline int ReadUntilRS232Port(RS232PORT* pRS232Port, uint8* readbuf, char endchar, int maxreadbuflen)
{
	int BytesReceived = 0;
	int Bytes = 0;

	// Receive byte per byte.
	while ((BytesReceived <= 0)||(readbuf[BytesReceived-1] != endchar))
	{
		if (BytesReceived >= maxreadbuflen)
		{
			PRINT_DEBUG_ERROR_RS232PORT(("ReadUntilRS232Port error (%s) : %s"
				"(pRS232Port=%#x, readbuf=%#x, endchar=%.2x, maxreadbuflen=%d)\n", 
				strtime_m(), 
				"readbuf full. ", 
				pRS232Port, readbuf, (int)(unsigned char)endchar, maxreadbuflen));
			PRINT_DEBUG_MESSAGE_RS232PORT(("Total bytes received : %d\n", BytesReceived));
			return EXIT_OUT_OF_MEMORY;
		}

		// Receive 1 byte.
		if (ReadRS232Port(pRS232Port, readbuf + BytesReceived, 1, &Bytes) == EXIT_SUCCESS)
		{
			if (Bytes == 0)
			{
				PRINT_DEBUG_WARNING_RS232PORT(("ReadUntilRS232Port warning (%s) : %s"
					"(pRS232Port=%#x, readbuf=%#x, endchar=%.2x, maxreadbuflen=%d)\n", 
					strtime_m(), 
					szOSUtilsErrMsgs[EXIT_TIMEOUT], 
					pRS232Port, readbuf, (int)(unsigned char)endchar, maxreadbuflen));
				PRINT_DEBUG_MESSAGE_RS232PORT(("Total bytes received : %d\n", BytesReceived));
				return EXIT_TIMEOUT;
			}
			else
			{
				PRINT_DEBUG_MESSAGE_RS232PORT(("Bytes received : %d\n", Bytes));
			}
		}
		else
		{
			PRINT_DEBUG_ERROR_RS232PORT(("ReadUntilRS232Port error (%s) : %s"
				"(pRS232Port=%#x, readbuf=%#x, endchar=%.2x, maxreadbuflen=%d)\n", 
				strtime_m(), 
				"ReadRS232Port failed. ", 
				pRS232Port, readbuf, (int)(unsigned char)endchar, maxreadbuflen));
			PRINT_DEBUG_MESSAGE_RS232PORT(("Total bytes received : %d\n", BytesReceived));
			return EXIT_FAILURE;
		}

		BytesReceived += Bytes;
	}

	PRINT_DEBUG_MESSAGE_RS232PORT(("Total bytes received : %d\n", BytesReceived));

	//*pBytesReceived = BytesReceived;

	return EXIT_SUCCESS;
}